

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

index_t __thiscall xLearn::FromDMReader::Samples(FromDMReader *this,DMatrix **matrix)

{
  value_type vVar1;
  value_type pvVar2;
  long lVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  reference pvVar4;
  reference ppvVar5;
  reference pvVar6;
  long *in_RSI;
  long in_RDI;
  int i;
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  value_type in_stack_ffffffffffffffc4;
  uint local_1c;
  
  local_1c = 0;
  do {
    if (*(uint *)(in_RDI + 0xe0) <= local_1c) {
LAB_001bf677:
      *in_RSI = in_RDI + 0x28;
      return *(index_t *)(in_RDI + 0xe0);
    }
    if (*(uint *)(*(long *)(in_RDI + 0xd8) + 0x10) <= *(uint *)(in_RDI + 0xe4)) {
      if (local_1c == 0) {
        if ((*(byte *)(in_RDI + 0x99) & 1) != 0) {
          srand(*(int *)(in_RDI + 0xd0) + 1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffff98);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffff98);
          __first._M_current._4_4_ = in_stack_ffffffffffffffc4;
          __first._M_current._0_4_ = in_stack_ffffffffffffffc0;
          std::
          random_shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    (__first,in_stack_ffffffffffffffb8);
        }
        *in_RSI = 0;
        return 0;
      }
      goto LAB_001bf677;
    }
    in_stack_ffffffffffffff98 =
         (vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
          *)(*(long *)(in_RDI + 0xd8) + 0x18);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xe8),
                        (ulong)*(uint *)(in_RDI + 0xe4));
    ppvVar5 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[](in_stack_ffffffffffffff98,(ulong)*pvVar4);
    pvVar2 = *ppvVar5;
    ppvVar5 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                            *)(in_RDI + 0x40),(long)(int)local_1c);
    *ppvVar5 = pvVar2;
    lVar3 = *(long *)(in_RDI + 0xd8);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xe8),
                        (ulong)*(uint *)(in_RDI + 0xe4));
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(lVar3 + 0x30),(ulong)*pvVar4);
    vVar1 = *pvVar6;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x58),(long)(int)local_1c
                       );
    *pvVar6 = vVar1;
    in_stack_ffffffffffffffb8._M_current = (uint *)(*(long *)(in_RDI + 0xd8) + 0x48);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xe8),
                        (ulong)*(uint *)(in_RDI + 0xe4));
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        in_stack_ffffffffffffffb8._M_current,(ulong)*pvVar4);
    in_stack_ffffffffffffffc4 = *pvVar6;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x70),(long)(int)local_1c
                       );
    *pvVar6 = in_stack_ffffffffffffffc4;
    *(int *)(in_RDI + 0xe4) = *(int *)(in_RDI + 0xe4) + 1;
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

index_t FromDMReader::Samples(DMatrix* &matrix) {
  for (int i = 0; i < num_samples_; ++i) {
    if (pos_ >= this->data_ptr_->row_length) {
      // End of the data buffer
      if (i == 0) {
        if (shuffle_) {
          srand(this->seed_+1);
          random_shuffle(order_.begin(), order_.end());
        }
        matrix = nullptr;
        return 0;
      }
      break;
    }
    // Copy data between different DMatrix.
    data_samples_.row[i] = this->data_ptr_->row[order_[pos_]];
    data_samples_.Y[i] = this->data_ptr_->Y[order_[pos_]];
    data_samples_.norm[i] = this->data_ptr_->norm[order_[pos_]];
    pos_++;
  }
  matrix = &data_samples_;
  return num_samples_;
}